

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::Maybe<kj::AutoCloseFd>_> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>(AsyncStreamFd *this)

{
  PromiseBase PVar1;
  PromiseNode *pPVar2;
  int iVar3;
  ssize_t sVar4;
  TransformPromiseNodeBase *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Disposer *extraout_RAX;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  _func_int **in_RSI;
  AutoCloseFd *this_00;
  Own<kj::_::ChainPromiseNode> OVar6;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>_>_> OVar7;
  Fault f;
  char c;
  Fault f_1;
  anon_union_24_2_c6a5a82d anon_var_2;
  msghdr msg;
  undefined1 local_d0 [8];
  TransformPromiseNodeBase *local_c8;
  undefined1 local_b9;
  Fault local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  PromiseNode *local_a0;
  undefined1 local_98 [12];
  Maybe<kj::AutoCloseFd> local_8c;
  PromiseFulfiller<void> *local_80;
  int local_78;
  int local_74;
  int local_70;
  iovec local_68;
  msghdr local_58;
  
  local_58.msg_name = (void *)0x0;
  local_58.msg_namelen = 0;
  local_58._12_4_ = 0;
  local_58.msg_flags = 0;
  local_58._52_4_ = 0;
  local_68.iov_base = &local_b9;
  local_58.msg_iov = &local_68;
  local_68.iov_len = 1;
  local_58.msg_iovlen = 1;
  local_58.msg_control = &local_80;
  local_58.msg_controllen = 0x18;
  while( true ) {
    sVar4 = recvmsg(*(int *)(in_RSI + 2),&local_58,0x40000000);
    if (-1 < sVar4) break;
    iVar3 = kj::_::Debug::getOsErrorNumber(true);
    if (iVar3 != -1) {
      if (iVar3 == 0) {
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_a8);
        pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar5,(Own<kj::_::PromiseNode> *)local_a8,
                   kj::_::
                   TransformPromiseNode<kj::Promise<kj::Maybe<kj::AutoCloseFd>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:467:50),_kj::_::PropagateException>
                   ::anon_class_8_1_8991fb9c_for_func::operator());
        (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062cf88;
        pTVar5[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
        local_d0 = (undefined1  [8])
                   &kj::_::
                    HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::Maybe<kj::AutoCloseFd>>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::AutoCloseFd>()::{lambda()#2},kj::_::PropagateException>>
                    ::instance;
        local_c8 = pTVar5;
        OVar6 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                          ((kj *)&local_b8,(Own<kj::_::PromiseNode> *)local_d0);
        pTVar5 = local_c8;
        *(undefined4 *)
         &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = local_b8.exception._0_4_;
        *(undefined4 *)
         ((long)&(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                 _vptr_AsyncInputStream + 4) = local_b8.exception._4_4_;
        *(undefined4 *)
         &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
          _vptr_AsyncOutputStream = (undefined4)uStack_b0;
        *(undefined4 *)
         ((long)&(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
                 _vptr_AsyncOutputStream + 4) = uStack_b0._4_4_;
        if (local_c8 != (TransformPromiseNodeBase *)0x0) {
          local_c8 = (TransformPromiseNodeBase *)0x0;
          iVar3 = (***(_func_int ***)local_d0)
                            (local_d0,(pTVar5->super_PromiseNode)._vptr_PromiseNode[-2] +
                                      (long)&(pTVar5->super_PromiseNode)._vptr_PromiseNode);
          OVar6.disposer._4_4_ = extraout_var;
          OVar6.disposer._0_4_ = iVar3;
          OVar6.ptr = extraout_RDX;
        }
        pPVar2 = local_a0;
        if (local_a0 != (PromiseNode *)0x0) {
          local_a0 = (PromiseNode *)0x0;
          iVar3 = (**((EventPort *)local_a8)->_vptr_EventPort)
                            (local_a8,pPVar2->_vptr_PromiseNode[-2] +
                                      (long)&pPVar2->_vptr_PromiseNode);
          OVar6.disposer._4_4_ = extraout_var_00;
          OVar6.disposer._0_4_ = iVar3;
          OVar6.ptr = extraout_RDX_00;
        }
        return (PromiseBase)(PromiseBase)OVar6;
      }
      local_d0._0_4_ = 0;
      local_d0._4_4_ = 0;
      local_b8.exception = (Exception *)0x0;
      uStack_b0 = (_func_int **)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_d0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_d0);
    }
  }
  if (sVar4 == 0) {
    local_8c.ptr.isSet = false;
    OVar7 = heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>>,kj::Maybe<kj::AutoCloseFd>>
                      ((kj *)&local_b8,&local_8c);
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_b8.exception;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = uStack_b0;
    if (local_8c.ptr.isSet != true) {
      return (Promise<kj::Maybe<kj::AutoCloseFd>_>)OVar7;
    }
    this_00 = (AutoCloseFd *)&local_8c.ptr.field_1;
  }
  else {
    if (local_58.msg_controllen < 0x10) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58]>
                (&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x1da,FAILED,"msg.msg_controllen >= sizeof(cmsg)",
                 "\"expected to receive FD over socket; received data instead\"",
                 (char (*) [58])"expected to receive FD over socket; received data instead");
      kj::_::Debug::Fault::fatal(&local_b8);
    }
    if (local_78 != 1) {
      local_d0._0_4_ = 0;
      local_d0._4_4_ = 0;
      local_b8.exception = (Exception *)0x0;
      uStack_b0 = (_func_int **)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_d0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_d0);
    }
    if (local_74 != 1) {
      local_d0._0_4_ = 0;
      local_d0._4_4_ = 0;
      local_b8.exception = (Exception *)0x0;
      uStack_b0 = (_func_int **)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_d0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_d0);
    }
    if (local_80 != (PromiseFulfiller<void> *)0x14) {
      local_d0._0_4_ = 0;
      local_d0._4_4_ = 0;
      local_b8.exception = (Exception *)0x0;
      uStack_b0 = (_func_int **)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)local_d0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_d0);
    }
    local_d0._0_4_ = local_70;
    UnwindDetector::UnwindDetector((UnwindDetector *)(local_d0 + 4));
    local_98[0] = true;
    local_98._4_4_ = local_d0._0_4_;
    UnwindDetector::UnwindDetector((UnwindDetector *)(local_98 + 8));
    local_d0._0_4_ = -1;
    heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::AutoCloseFd>>,kj::Maybe<kj::AutoCloseFd>>
              ((kj *)&local_b8,(Maybe<kj::AutoCloseFd> *)local_98);
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_b8.exception;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = uStack_b0;
    if (local_98[0] == true) {
      AutoCloseFd::~AutoCloseFd((AutoCloseFd *)(local_98 + 4));
    }
    this_00 = (AutoCloseFd *)local_d0;
  }
  AutoCloseFd::~AutoCloseFd(this_00);
  PVar1.node.ptr = extraout_RDX_01;
  PVar1.node.disposer = extraout_RAX;
  return (Promise<kj::Maybe<kj::AutoCloseFd>_>)PVar1.node;
}

Assistant:

kj::Promise<kj::Maybe<T>> tryReceiveFdImpl() {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct iovec iov;
    memset(&iov, 0, sizeof(iov));
    char c;
    iov.iov_base = &c;
    iov.iov_len = 1;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    // Allocate space to receive a cmsg.
    union {
      struct cmsghdr cmsg;
      char cmsgSpace[CMSG_SPACE(sizeof(int))];
    };
    msg.msg_control = &cmsg;
    msg.msg_controllen = sizeof(cmsgSpace);

#ifdef MSG_CMSG_CLOEXEC
    int recvmsgFlags = MSG_CMSG_CLOEXEC;
#else
    int recvmsgFlags = 0;
#endif

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(fd, &msg, recvmsgFlags));
    if (n < 0) {
      return observer.whenBecomesReadable().then([this]() {
        return tryReceiveFdImpl<T>();
      });
    } else if (n == 0) {
      return kj::Maybe<T>(nullptr);
    } else {
      KJ_REQUIRE(msg.msg_controllen >= sizeof(cmsg),
          "expected to receive FD over socket; received data instead");

      // We expect an SCM_RIGHTS message with a single FD.
      KJ_REQUIRE(cmsg.cmsg_level == SOL_SOCKET);
      KJ_REQUIRE(cmsg.cmsg_type == SCM_RIGHTS);
      KJ_REQUIRE(cmsg.cmsg_len == CMSG_LEN(sizeof(int)));

      int receivedFd;
      memcpy(&receivedFd, CMSG_DATA(&cmsg), sizeof(receivedFd));
      return kj::Maybe<T>(wrapFd(receivedFd, (T*)nullptr));
    }
  }